

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

TaskHandle __thiscall
Task::dealloc(Task *this,
             vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands)

{
  __shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TaskHandle TVar5;
  OperandUsage OStack_98;
  
  std::make_shared<Task>();
  std::__cxx11::string::assign((char *)(*(long *)this + 8));
  p_Var1 = &((operands->
             super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>;
  _Var3._M_pi = extraout_RDX;
  for (p_Var4 = &((operands->
                  super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>; p_Var4 != p_Var1;
      p_Var4 = p_Var4 + 1) {
    lVar2 = *(long *)this;
    std::__shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2> *)&OStack_98,p_Var4);
    OStack_98.next_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    OStack_98.last_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    OStack_98.prev_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    OStack_98.next_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    OStack_98.next_gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    OStack_98.prev_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    OStack_98.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    OStack_98.next_gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    OStack_98.version = 0;
    OStack_98.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    OStack_98.last_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<OperandUsage,_std::allocator<OperandUsage>_>::emplace_back<OperandUsage>
              ((vector<OperandUsage,_std::allocator<OperandUsage>_> *)(lVar2 + 0x48),&OStack_98);
    OperandUsage::~OperandUsage(&OStack_98);
    _Var3._M_pi = extraout_RDX_00;
  }
  TVar5.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  TVar5.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TaskHandle)TVar5.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static TaskHandle dealloc(const std::vector<OperandHandle> &operands) {
        auto task = std::make_shared<Task>();
        task->name = ".dealloc";
        for (auto &operand: operands) {
            task->outs.push_back(OperandUsage{ operand });
        }
        return task;
    }